

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

Type * __thiscall
soul::AST::TypeMetaFunction::getSourceType(Type *__return_storage_ptr__,TypeMetaFunction *this)

{
  Structure *pSVar1;
  Category CVar2;
  bool bVar3;
  bool bVar4;
  BoundedIntSize BVar5;
  int iVar6;
  Expression *pEVar7;
  vector<soul::Type,_std::allocator<soul::Type>_> types;
  pool_ptr<soul::AST::EndpointDeclaration> endpoint;
  vector<soul::Type,_std::allocator<soul::Type>_> local_70;
  long local_58;
  CompileMessage local_50;
  
  pEVar7 = (this->source).object;
  if (pEVar7->kind == type) {
    iVar6 = (*(pEVar7->super_Statement).super_ASTObject._vptr_ASTObject[3])(pEVar7);
    pEVar7 = (this->source).object;
    if ((char)iVar6 != '\0') {
      (*(pEVar7->super_Statement).super_ASTObject._vptr_ASTObject[5])(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  (*(pEVar7->super_Statement).super_ASTObject._vptr_ASTObject[8])(&local_58);
  if (local_58 == 0) {
    (*(((this->source).object)->super_Statement).super_ASTObject._vptr_ASTObject[4])
              (__return_storage_ptr__);
  }
  else {
    if (*(EndpointDetails **)(local_58 + 0x38) == (EndpointDetails *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    EndpointDetails::getResolvedDataTypes(&local_70,*(EndpointDetails **)(local_58 + 0x38));
    if ((long)local_70.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_70.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
              super__Vector_impl_data._M_start != 0x18) {
      CompileMessageHelpers::createMessage<>
                (&local_50,syntax,error,"This endpoint has more than one type");
      Context::throwError(&(this->super_Expression).super_Statement.super_ASTObject.context,
                          &local_50,false);
    }
    CVar2 = (local_70.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
             super__Vector_impl_data._M_start)->arrayElementCategory;
    bVar3 = (local_70.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
             super__Vector_impl_data._M_start)->isRef;
    bVar4 = (local_70.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
             super__Vector_impl_data._M_start)->isConstant;
    __return_storage_ptr__->category =
         (local_70.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
          super__Vector_impl_data._M_start)->category;
    __return_storage_ptr__->arrayElementCategory = CVar2;
    __return_storage_ptr__->isRef = bVar3;
    __return_storage_ptr__->isConstant = bVar4;
    (__return_storage_ptr__->primitiveType).type =
         ((local_70.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->primitiveType).type;
    BVar5 = (local_70.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
             super__Vector_impl_data._M_start)->arrayElementBoundingSize;
    __return_storage_ptr__->boundingSize =
         (local_70.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
          super__Vector_impl_data._M_start)->boundingSize;
    __return_storage_ptr__->arrayElementBoundingSize = BVar5;
    pSVar1 = ((local_70.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
               super__Vector_impl_data._M_start)->structure).object;
    (__return_storage_ptr__->structure).object = pSVar1;
    if (pSVar1 != (Structure *)0x0) {
      (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
    }
    std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

Type getSourceType() const
        {
            if (isResolvedAsType (source.get()))
                return source->resolveAsType();

            if (auto endpoint = source->getAsEndpoint())
            {
                auto types = endpoint->getDetails().getResolvedDataTypes();

                if (types.size() == 1)
                    return types.front();

                context.throwError (Errors::endpointHasMultipleTypes());
            }

            return source->getResultType();
        }